

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O1

void __thiscall wasm::WasmSplitOptions::WasmSplitOptions(WasmSplitOptions *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  __node_base_ptr *pp_Var4;
  long lVar5;
  initializer_list<wasm::WasmSplitOptions::Mode> __l;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_00;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_01;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_02;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_03;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_04;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_05;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_06;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_07;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_08;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_09;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_10;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_11;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_12;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_13;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_14;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_15;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_16;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_17;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_18;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_19;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_20;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_21;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_22;
  Mode local_12e0 [14];
  _Any_data local_12a8;
  code *local_1298;
  code *pcStack_1290;
  _Any_data local_1288;
  code *local_1278;
  code *pcStack_1270;
  _Any_data local_1268;
  code *local_1258;
  code *pcStack_1250;
  _Any_data local_1248;
  code *local_1238;
  code *pcStack_1230;
  _Any_data local_1228;
  code *local_1218;
  code *pcStack_1210;
  _Any_data local_1208;
  code *local_11f8;
  code *pcStack_11f0;
  _Any_data local_11e8;
  code *local_11d8;
  code *pcStack_11d0;
  _Any_data local_11c8;
  code *local_11b8;
  code *pcStack_11b0;
  _Any_data local_11a8;
  code *local_1198;
  code *pcStack_1190;
  _Any_data local_1188;
  code *local_1178;
  code *pcStack_1170;
  _Any_data local_1168;
  code *local_1158;
  code *pcStack_1150;
  _Any_data local_1148;
  code *local_1138;
  code *pcStack_1130;
  _Any_data local_1128;
  code *local_1118;
  code *pcStack_1110;
  _Any_data local_1108;
  code *local_10f8;
  code *pcStack_10f0;
  _Any_data local_10e8;
  code *local_10d8;
  code *pcStack_10d0;
  _Any_data local_10c8;
  code *local_10b8;
  code *pcStack_10b0;
  _Any_data local_10a8;
  code *local_1098;
  code *pcStack_1090;
  _Any_data local_1088;
  code *local_1078;
  code *pcStack_1070;
  _Any_data local_1068;
  code *local_1058;
  code *pcStack_1050;
  _Any_data local_1048;
  code *local_1038;
  code *pcStack_1030;
  _Any_data local_1028;
  code *local_1018;
  code *pcStack_1010;
  _Any_data local_1008;
  code *local_ff8;
  code *pcStack_ff0;
  _Any_data local_fe8;
  code *local_fd8;
  code *pcStack_fd0;
  _Any_data local_fc8;
  code *local_fb8;
  code *pcStack_fb0;
  _Any_data local_fa8;
  code *local_f98;
  code *pcStack_f90;
  _Any_data local_f88;
  code *local_f78;
  code *pcStack_f70;
  _Any_data local_f68;
  code *local_f58;
  code *pcStack_f50;
  _Any_data local_f48;
  code *local_f38;
  code *pcStack_f30;
  _Any_data local_f28;
  code *local_f18;
  code *pcStack_f10;
  _Any_data local_f08;
  code *local_ef8;
  code *pcStack_ef0;
  WasmSplitOptions *local_ee8;
  undefined8 uStack_ee0;
  code *local_ed8;
  code *pcStack_ed0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  long *local_e60 [2];
  long local_e50 [2];
  Mode local_e40 [18];
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_df8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_de0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_dc8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_db0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d98;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d80;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d68;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d50;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d38;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d20;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_d08;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_cf0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_cd8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_cc0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_ca8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c90;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c78;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c60;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c48;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c30;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c18;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c00;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_be8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_bd0;
  string *local_bb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_bb0;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  allocator_type local_70;
  allocator_type local_6f;
  allocator_type local_6e;
  allocator_type local_6d;
  allocator_type local_6c;
  allocator_type local_6b;
  allocator_type local_6a;
  allocator_type local_69;
  allocator_type local_68;
  allocator_type local_67;
  allocator_type local_66;
  allocator_type local_65;
  allocator_type local_64;
  allocator_type local_63;
  allocator_type local_62;
  allocator_type local_61;
  allocator_type local_60;
  allocator_type local_5f;
  allocator_type local_5e;
  allocator_type local_5d;
  allocator_type local_5c;
  allocator_type local_5b;
  allocator_type local_5a;
  allocator_type local_59;
  undefined1 local_58 [8];
  string WasmSplitOption;
  
  psVar1 = &WasmSplitOption._M_string_length;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"wasm-split","");
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "Split a module into a primary module and a secondary module, or instrument a module to gather a profile that can inform future splitting, or manage such profiles. Options that are only accepted in particular modes are marked with the accepted \"[<modes>]\" in their descriptions."
             ,"");
  ToolOptions::ToolOptions(&this->super_ToolOptions,(string *)local_58,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_58,WasmSplitOption._M_string_length + 1);
  }
  (this->super_ToolOptions)._vptr_ToolOptions = (_func_int **)&PTR_addPassArg_0012dc60;
  this->mode = Split;
  this->storageKind = InGlobals;
  this->usePlaceholders = true;
  this->unescape = false;
  this->verbose = false;
  this->emitBinary = true;
  this->symbolMap = false;
  this->placeholderMap = false;
  this->jspi = false;
  this->emitModuleNames = false;
  local_e8 = &(this->profileFile).field_2;
  (this->profileFile)._M_dataplus._M_p = (pointer)local_e8;
  (this->profileFile)._M_string_length = 0;
  (this->profileFile).field_2._M_local_buf[0] = '\0';
  local_e0 = &(this->profileExport).field_2;
  (this->profileExport)._M_dataplus._M_p = (pointer)local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->profileExport,DEFAULT_PROFILE_EXPORT_abi_cxx11_,
             DAT_0012e428 + DEFAULT_PROFILE_EXPORT_abi_cxx11_);
  p_Var3 = &(this->keepFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->splitFuncs)._M_t._M_impl.super__Rb_tree_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->hasKeepFuncs = false;
  this->hasSplitFuncs = false;
  local_bb0 = &this->inputFiles;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = &(this->output).field_2;
  (this->output)._M_dataplus._M_p = (pointer)local_d8;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  local_d0 = &(this->primaryOutput).field_2;
  (this->primaryOutput)._M_dataplus._M_p = (pointer)local_d0;
  (this->primaryOutput)._M_string_length = 0;
  (this->primaryOutput).field_2._M_local_buf[0] = '\0';
  local_c8 = &(this->secondaryOutput).field_2;
  (this->secondaryOutput)._M_dataplus._M_p = (pointer)local_c8;
  (this->secondaryOutput)._M_string_length = 0;
  (this->secondaryOutput).field_2._M_local_buf[0] = '\0';
  local_c0 = &(this->importNamespace).field_2;
  (this->importNamespace)._M_dataplus._M_p = (pointer)local_c0;
  (this->importNamespace)._M_string_length = 0;
  (this->importNamespace).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->placeholderNamespace).field_2;
  (this->placeholderNamespace)._M_dataplus._M_p = (pointer)local_b8;
  (this->placeholderNamespace)._M_string_length = 0;
  (this->placeholderNamespace).field_2._M_local_buf[0] = '\0';
  local_b0 = &(this->secondaryMemoryName).field_2;
  (this->secondaryMemoryName)._M_dataplus._M_p = (pointer)local_b0;
  (this->secondaryMemoryName)._M_string_length = 0;
  (this->secondaryMemoryName).field_2._M_local_buf[0] = '\0';
  local_a8 = &(this->exportPrefix).field_2;
  (this->exportPrefix)._M_dataplus._M_p = (pointer)local_a8;
  (this->exportPrefix)._M_string_length = 0;
  (this->exportPrefix).field_2._M_local_buf[0] = '\0';
  local_a0 = &(this->manifestFile).field_2;
  (this->manifestFile)._M_dataplus._M_p = (pointer)local_a0;
  (this->manifestFile)._M_string_length = 0;
  (this->manifestFile).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->outPrefix).field_2;
  (this->outPrefix)._M_dataplus._M_p = (pointer)local_98;
  (this->outPrefix)._M_string_length = 0;
  (this->outPrefix).field_2._M_local_buf[0] = '\0';
  this->initialTableSize = -1;
  pp_Var4 = &(this->validOptions)._M_elems[0]._M_h._M_single_bucket;
  lVar5 = 0x118;
  do {
    ((_Hashtable *)(pp_Var4 + -6))->_M_buckets = pp_Var4;
    pp_Var4[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var4 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var4[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var4 + -2))->_M_max_load_factor = 1.0;
    pp_Var4[-1] = (__node_base_ptr)0x0;
    *pp_Var4 = (__node_base_ptr)0x0;
    pp_Var4 = pp_Var4 + 7;
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != 0);
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->usedOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bb8 = &this->profileExport;
  local_58 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"wasm-split options","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--split","");
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba8,"");
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,"Split an input module into two output modules. The default mode."
             ,"");
  local_12a8._8_8_ = 0;
  pcStack_1290 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:97:10)>
                 ::_M_invoke;
  local_1298 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:97:10)>
               ::_M_manager;
  local_12a8._M_unused._M_object = this;
  add(this,&local_90,&local_ba8,&local_b88,(string *)local_58,Zero,(Action *)&local_12a8);
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"--multi-split","");
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"");
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b28,
             "Split an input module into an arbitrary number of output modules.","");
  local_1288._8_8_ = 0;
  pcStack_1270 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:104:7)>
                 ::_M_invoke;
  local_1278 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:104:7)>
               ::_M_manager;
  local_1288._M_unused._M_object = this;
  add(this,&local_b68,&local_b48,&local_b28,(string *)local_58,Zero,(Action *)&local_1288);
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"--instrument","");
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae8,"");
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac8,
             "Instrument an input module to allow it to generate a profile that can be used to guide splitting."
             ,"");
  local_1268._8_8_ = 0;
  pcStack_1250 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:112:7)>
                 ::_M_invoke;
  local_1258 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:112:7)>
               ::_M_manager;
  local_1268._M_unused._M_object = this;
  add(this,&local_b08,&local_ae8,&local_ac8,(string *)local_58,Zero,(Action *)&local_1268);
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa8,"--merge-profiles","");
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"");
  local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a68,
             "Merge multiple profiles for the same module into a single profile.","");
  local_1248._8_8_ = 0;
  pcStack_1230 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:118:10)>
                 ::_M_invoke;
  local_1238 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:118:10)>
               ::_M_manager;
  local_1248._M_unused._M_object = this;
  add(this,&local_aa8,&local_a88,&local_a68,(string *)local_58,Zero,(Action *)&local_1248);
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"--print-profile","");
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"");
  local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a08,"Print profile contents in a human-readable format.","");
  local_e40[0] = PrintProfile;
  __l._M_len = 1;
  __l._M_array = local_e40;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_df8,__l,&local_70);
  local_1228._8_8_ = 0;
  pcStack_1210 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:127:10)>
                 ::_M_invoke;
  local_1218 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:127:10)>
               ::_M_manager;
  local_1228._M_unused._M_object = this;
  add(this,&local_a48,&local_a28,&local_a08,(string *)local_58,&local_df8,One,(Action *)&local_1228)
  ;
  local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"--profile","");
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"");
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9a8,"The profile to use to guide splitting.","");
  local_e40[1] = 0;
  __l_00._M_len = 1;
  __l_00._M_array = local_e40 + 1;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_de0,__l_00,&local_6f);
  local_1208._8_8_ = 0;
  pcStack_11f0 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:138:7)>
                 ::_M_invoke;
  local_11f8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:138:7)>
               ::_M_manager;
  local_1208._M_unused._M_object = this;
  add(this,&local_9e8,&local_9c8,&local_9a8,(string *)local_58,&local_de0,One,(Action *)&local_1208)
  ;
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"--keep-funcs","");
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"");
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_948,
             "Comma-separated list of functions to keep in the primary module. The rest will be split out. Can be used alongside --profile and --split-funcs. You can also pass a file with one function per line by passing @filename."
             ,"");
  local_e40[2] = 0;
  __l_01._M_len = 1;
  __l_01._M_array = local_e40 + 2;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_dc8,__l_01,&local_6e);
  local_11e8._8_8_ = 0;
  pcStack_11d0 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:148:10)>
                 ::_M_invoke;
  local_11d8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:148:10)>
               ::_M_manager;
  local_11e8._M_unused._M_object = this;
  add(this,&local_988,&local_968,&local_948,(string *)local_58,&local_dc8,One,(Action *)&local_11e8)
  ;
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"--split-funcs","");
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"");
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e8,
             "Comma-separated list of functions to split out to the secondary module. The rest will be kept. Can be used alongside --profile and --keep-funcs. This takes precedence over other split options. You can also pass a file with one function per line by passing @filename."
             ,"");
  local_e40[3] = 0;
  __l_02._M_len = 1;
  __l_02._M_array = local_e40 + 3;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_db0,__l_02,&local_6d);
  local_11c8._8_8_ = 0;
  pcStack_11b0 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:162:10)>
                 ::_M_invoke;
  local_11b8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:162:10)>
               ::_M_manager;
  local_11c8._M_unused._M_object = this;
  add(this,&local_928,&local_908,&local_8e8,(string *)local_58,&local_db0,One,(Action *)&local_11c8)
  ;
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"--manifest","");
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"");
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,
             "File describing the functions to be split into each module. Each section separated by a blank line begins with the base name of an output module, which is followed by a list of functions to place in that module, one per line."
             ,"");
  local_e40[4] = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_e40 + 4;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d98,__l_03,&local_6c);
  local_11a8._8_8_ = 0;
  pcStack_1190 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:176:7)>
                 ::_M_invoke;
  local_1198 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:176:7)>
               ::_M_manager;
  local_11a8._M_unused._M_object = this;
  add(this,&local_8c8,&local_8a8,&local_888,(string *)local_58,&local_d98,One,(Action *)&local_11a8)
  ;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"--out-prefix","");
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"");
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_828,
             "Prefix prepended to module names in the manifest file to create output file names.",""
            );
  local_e40[5] = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_e40 + 5;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d80,__l_04,&local_6b);
  local_1188._8_8_ = 0;
  pcStack_1170 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:184:10)>
                 ::_M_invoke;
  local_1178 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:184:10)>
               ::_M_manager;
  local_1188._M_unused._M_object = this;
  add(this,&local_868,&local_848,&local_828,(string *)local_58,&local_d80,One,(Action *)&local_1188)
  ;
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"--primary-output","");
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"-o1","");
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7c8,"Output file for the primary module.","");
  local_e40[6] = 0;
  __l_05._M_len = 1;
  __l_05._M_array = local_e40 + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d68,__l_05,&local_6a);
  local_1168._8_8_ = 0;
  pcStack_1150 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:191:10)>
                 ::_M_invoke;
  local_1158 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:191:10)>
               ::_M_manager;
  local_1168._M_unused._M_object = this;
  add(this,&local_808,&local_7e8,&local_7c8,(string *)local_58,&local_d68,One,(Action *)&local_1168)
  ;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"--secondary-output","");
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"-o2","");
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"Output file for the secondary module.","");
  local_e40[7] = 0;
  __l_06._M_len = 1;
  __l_06._M_array = local_e40 + 7;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d50,__l_06,&local_69);
  local_1148._8_8_ = 0;
  pcStack_1130 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:200:10)>
                 ::_M_invoke;
  local_1138 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:200:10)>
               ::_M_manager;
  local_1148._M_unused._M_object = this;
  add(this,&local_7a8,&local_788,&local_768,(string *)local_58,&local_d50,One,(Action *)&local_1148)
  ;
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"--symbolmap","");
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"");
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_708,"Write a symbol map file for each of the output modules.","");
  local_e40[8] = 0;
  __l_07._M_len = 1;
  __l_07._M_array = local_e40 + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d38,__l_07,&local_68);
  local_1128._8_8_ = 0;
  pcStack_1110 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:209:10)>
                 ::_M_invoke;
  local_1118 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:209:10)>
               ::_M_manager;
  local_1128._M_unused._M_object = this;
  add(this,&local_748,&local_728,&local_708,(string *)local_58,&local_d38,Zero,(Action *)&local_1128
     );
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"--no-placeholders","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6a8,
             "Do not import placeholder functions. Calls to secondary functions will fail before the secondary module has been instantiated."
             ,"");
  local_e40[9] = 0;
  __l_08._M_len = 1;
  __l_08._M_array = local_e40 + 9;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d20,__l_08,&local_67);
  local_1108._8_8_ = 0;
  pcStack_10f0 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:218:7)>
                 ::_M_invoke;
  local_10f8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:218:7)>
               ::_M_manager;
  local_1108._M_unused._M_object = this;
  add(this,&local_6e8,&local_6c8,&local_6a8,(string *)local_58,&local_d20,Zero,(Action *)&local_1108
     );
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"--placeholdermap","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"");
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_648,"Write a file mapping placeholder indices to the function names.",
             "");
  local_e40[10] = 0;
  __l_09._M_len = 1;
  __l_09._M_array = local_e40 + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_d08,__l_09,&local_66);
  local_10e8._8_8_ = 0;
  pcStack_10d0 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:226:7)>
                 ::_M_invoke;
  local_10d8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:226:7)>
               ::_M_manager;
  local_10e8._M_unused._M_object = this;
  add(this,&local_688,&local_668,&local_648,(string *)local_58,&local_d08,Zero,(Action *)&local_10e8
     );
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"--import-namespace","");
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e8,
             "When provided as an option for module splitting, the namespace from which to import objects from the primary module into the secondary module. In instrument mode, refers to the namespace from which to import the secondary memory, if any."
             ,"");
  local_12e0[6] = Split;
  local_12e0[7] = Instrument;
  __l_10._M_len = 2;
  __l_10._M_array = local_12e0 + 6;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_cf0,__l_10,&local_65);
  local_10c8._8_8_ = 0;
  pcStack_10b0 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:236:10)>
                 ::_M_invoke;
  local_10b8 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:236:10)>
               ::_M_manager;
  local_10c8._M_unused._M_object = this;
  add(this,&local_628,&local_608,&local_5e8,(string *)local_58,&local_cf0,One,(Action *)&local_10c8)
  ;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"--placeholder-namespace","")
  ;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,
             "The namespace from which to import placeholder functions into the primary module.","")
  ;
  local_e40[0xb] = 0;
  __l_11._M_len = 1;
  __l_11._M_array = local_e40 + 0xb;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_cd8,__l_11,&local_64);
  local_10a8._8_8_ = 0;
  pcStack_1090 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:246:10)>
                 ::_M_invoke;
  local_1098 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:246:10)>
               ::_M_manager;
  local_10a8._M_unused._M_object = this;
  add(this,&local_5c8,&local_5a8,&local_588,(string *)local_58,&local_cd8,One,(Action *)&local_10a8)
  ;
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"--jspi","");
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,
             "Transform the module to support asynchronously loading the secondary module before any placeholder functions have been called."
             ,"");
  local_e40[0xc] = 0;
  __l_12._M_len = 1;
  __l_12._M_array = local_e40 + 0xc;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_cc0,__l_12,&local_63);
  local_1088._8_8_ = 0;
  pcStack_1070 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:256:10)>
                 ::_M_invoke;
  local_1078 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:256:10)>
               ::_M_manager;
  local_1088._M_unused._M_object = this;
  add(this,&local_568,&local_548,&local_528,(string *)local_58,&local_cc0,Zero,(Action *)&local_1088
     );
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"--export-prefix","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c8,
             "An identifying prefix to prepend to new export names created by module splitting.","")
  ;
  local_e40[0xd] = 0;
  __l_13._M_len = 1;
  __l_13._M_array = local_e40 + 0xd;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_ca8,__l_13,&local_62);
  local_1068._8_8_ = 0;
  pcStack_1050 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:265:7)>
                 ::_M_invoke;
  local_1058 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:265:7)>
               ::_M_manager;
  local_1068._M_unused._M_object = this;
  add(this,&local_508,&local_4e8,&local_4c8,(string *)local_58,&local_ca8,One,(Action *)&local_1068)
  ;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"--profile-export","");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_468,
             "The export name of the function the embedder calls to write the profile into memory. Defaults to `__write_profile`."
             ,"");
  local_e40[0xe] = 2;
  __l_14._M_len = 1;
  __l_14._M_array = local_e40 + 0xe;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c90,__l_14,&local_61);
  local_1048._8_8_ = 0;
  pcStack_1030 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:273:10)>
                 ::_M_invoke;
  local_1038 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:273:10)>
               ::_M_manager;
  local_1048._M_unused._M_object = this;
  add(this,&local_4a8,&local_488,&local_468,(string *)local_58,&local_c90,One,(Action *)&local_1048)
  ;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"--in-memory","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_408,
             "Store profile information in memory (starting at address 0 and taking one byte per function) rather than globals (the default) so that it can be shared between multiple threads. Users are responsible for ensuring that the module does not use the initial memory region for anything else."
             ,"");
  local_e40[0xf] = 2;
  __l_15._M_len = 1;
  __l_15._M_array = local_e40 + 0xf;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c78,__l_15,&local_60);
  local_1028._8_8_ = 0;
  pcStack_1010 = std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:287:7)>
                 ::_M_invoke;
  local_1018 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:287:7)>
               ::_M_manager;
  local_1028._M_unused._M_object = this;
  add(this,&local_448,&local_428,&local_408,(string *)local_58,&local_c78,Zero,(Action *)&local_1028
     );
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"--in-secondary-memory","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "Store profile information in a separate memory, rather than in module main memory or globals (the default). With this option, users do not need to reserve the initial memory region for profile data and the data can be shared between multiple threads."
             ,"");
  local_e40[0x10] = 2;
  __l_16._M_len = 1;
  __l_16._M_array = local_e40 + 0x10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c60,__l_16,&local_5f);
  local_1008._8_8_ = 0;
  pcStack_ff0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:300:7)>
                ::_M_invoke;
  local_ff8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:300:7)>
              ::_M_manager;
  local_1008._M_unused._M_object = this;
  add(this,&local_3e8,&local_3c8,&local_3a8,(string *)local_58,&local_c60,Zero,(Action *)&local_1008
     );
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--secondary-memory-name","")
  ;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,
             "The name of the secondary memory created to store profile information.","");
  local_e40[0x11] = 2;
  __l_17._M_len = 1;
  __l_17._M_array = local_e40 + 0x11;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c48,__l_17,&local_5e);
  local_fe8._8_8_ = 0;
  pcStack_fd0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:310:10)>
                ::_M_invoke;
  local_fd8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:310:10)>
              ::_M_manager;
  local_fe8._M_unused._M_object = this;
  add(this,&local_388,&local_368,&local_348,(string *)local_58,&local_c48,One,(Action *)&local_fe8);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"--emit-module-names","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,
             "Emit module names, even if not emitting the rest of the names section. Can help differentiate the modules in stack traces. This option will be removed once simpler ways of naming modules are widely available. See https://bugs.chromium.org/p/v8/issues/detail?id=11808."
             ,"");
  local_12e0[8] = Split;
  local_12e0[9] = Instrument;
  __l_18._M_len = 2;
  __l_18._M_array = local_12e0 + 8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c30,__l_18,&local_5d);
  local_fc8._8_8_ = 0;
  pcStack_fb0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:323:7)>
                ::_M_invoke;
  local_fb8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:323:7)>
              ::_M_manager;
  local_fc8._M_unused._M_object = this;
  add(this,&local_328,&local_308,&local_2e8,(string *)local_58,&local_c30,Zero,(Action *)&local_fc8)
  ;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"--initial-table","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,
             "A hack to ensure the split and instrumented modules have the same table size when using Emscripten\'s SPLIT_MODULE mode with dynamic linking. TODO: Figure out a more elegant solution for that use case and remove this."
             ,"");
  local_12e0[10] = Split;
  local_12e0[0xb] = Instrument;
  __l_19._M_len = 2;
  __l_19._M_array = local_12e0 + 10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c18,__l_19,&local_5c);
  local_fa8._8_8_ = 0;
  pcStack_f90 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:333:10)>
                ::_M_invoke;
  local_f98 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:333:10)>
              ::_M_manager;
  local_fa8._M_unused._M_object = this;
  add(this,&local_2c8,&local_2a8,&local_288,(string *)local_58,&local_c18,One,(Action *)&local_fa8);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--emit-text","");
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"-S","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"Emit text instead of binary for the output file or files.","");
  local_12e0[0xc] = Split;
  local_12e0[0xd] = Instrument;
  __l_20._M_len = 2;
  __l_20._M_array = local_12e0 + 0xc;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c00,__l_20,&local_5b);
  local_f88._8_8_ = 0;
  pcStack_f70 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:342:10)>
                ::_M_invoke;
  local_f78 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:342:10)>
              ::_M_manager;
  local_f88._M_unused._M_object = this;
  add(this,&local_268,&local_248,&local_228,(string *)local_58,&local_c00,Zero,(Action *)&local_f88)
  ;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"--debuginfo","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"-g","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"Emit names section in wasm binary (or full debuginfo in wast)",""
            );
  local_12e0[0] = Split;
  local_12e0[1] = MultiSplit;
  local_12e0[2] = 2;
  __l_21._M_len = 3;
  __l_21._M_array = local_12e0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_be8,__l_21,&local_5a);
  local_f68._8_8_ = 0;
  pcStack_f50 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:349:10)>
                ::_M_invoke;
  local_f58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:349:10)>
              ::_M_manager;
  local_f68._M_unused._M_object = this;
  add(this,&local_208,&local_1e8,&local_1c8,(string *)local_58,&local_be8,Zero,(Action *)&local_f68)
  ;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"--output","");
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"-o","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Output file.","");
  local_12e0[3] = Instrument;
  local_12e0[4] = MergeProfiles;
  local_12e0[5] = 1;
  __l_22._M_len = 3;
  __l_22._M_array = local_12e0 + 3;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_bd0,__l_22,&local_59);
  local_f48._8_8_ = 0;
  pcStack_f30 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:358:10)>
                ::_M_invoke;
  local_f38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:358:10)>
              ::_M_manager;
  local_f48._M_unused._M_object = this;
  add(this,&local_1a8,&local_188,&local_168,(string *)local_58,&local_bd0,One,(Action *)&local_f48);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"--unescape","");
  local_ec0._M_dataplus._M_p = (pointer)&local_ec0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ec0,"-u","");
  local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ea0,"Un-escape function names (in print-profile output)","");
  local_f28._8_8_ = 0;
  pcStack_f10 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:364:10)>
                ::_M_invoke;
  local_f18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:364:10)>
              ::_M_manager;
  local_f28._M_unused._M_object = this;
  add(this,&local_148,&local_ec0,&local_ea0,(string *)local_58,Zero,(Action *)&local_f28);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"--verbose","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"-v","");
  local_e80._M_dataplus._M_p = (pointer)&local_e80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "Verbose output mode. Prints the functions that will be kept and split out when splitting a module."
             ,"");
  local_f08._8_8_ = 0;
  pcStack_ef0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:371:10)>
                ::_M_invoke;
  local_ef8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:371:10)>
              ::_M_manager;
  local_f08._M_unused._M_object = this;
  add(this,&local_128,&local_108,&local_e80,(string *)local_58,Zero,(Action *)&local_f08);
  local_e60[0] = local_e50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e60,"INFILES","");
  uStack_ee0 = 0;
  pcStack_ed0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:377:21)>
                ::_M_invoke;
  local_ed8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/split-options.cpp:377:21)>
              ::_M_manager;
  local_ee8 = this;
  wasm::Options::add_positional
            ((string *)&(this->super_ToolOptions).super_Options,(Arguments)local_e60,(function *)0x2
            );
  if (local_ed8 != (code *)0x0) {
    (*local_ed8)(&local_ee8,&local_ee8,3);
  }
  if (local_e60[0] != local_e50) {
    operator_delete(local_e60[0],local_e50[0] + 1);
  }
  if (local_ef8 != (code *)0x0) {
    (*local_ef8)(&local_f08,&local_f08,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
    operator_delete(local_e80._M_dataplus._M_p,local_e80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_f18 != (code *)0x0) {
    (*local_f18)(&local_f28,&local_f28,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ec0._M_dataplus._M_p != &local_ec0.field_2) {
    operator_delete(local_ec0._M_dataplus._M_p,local_ec0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_f38 != (code *)0x0) {
    (*local_f38)(&local_f48,&local_f48,__destroy_functor);
  }
  if (local_bd0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bd0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bd0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_f58 != (code *)0x0) {
    (*local_f58)(&local_f68,&local_f68,__destroy_functor);
  }
  if (local_be8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_be8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_be8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_be8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_f78 != (code *)0x0) {
    (*local_f78)(&local_f88,&local_f88,__destroy_functor);
  }
  if (local_c00.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c00.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c00.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c00.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_f98 != (code *)0x0) {
    (*local_f98)(&local_fa8,&local_fa8,__destroy_functor);
  }
  if (local_c18.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c18.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c18.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c18.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if (local_fb8 != (code *)0x0) {
    (*local_fb8)(&local_fc8,&local_fc8,__destroy_functor);
  }
  if (local_c30.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c30.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c30.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c30.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_fd8 != (code *)0x0) {
    (*local_fd8)(&local_fe8,&local_fe8,__destroy_functor);
  }
  if (local_c48.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c48.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c48.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c48.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_ff8 != (code *)0x0) {
    (*local_ff8)(&local_1008,&local_1008,__destroy_functor);
  }
  if (local_c60.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c60.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c60.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c60.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if (local_1018 != (code *)0x0) {
    (*local_1018)(&local_1028,&local_1028,__destroy_functor);
  }
  if (local_c78.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c78.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c78.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c78.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_1038 != (code *)0x0) {
    (*local_1038)(&local_1048,&local_1048,__destroy_functor);
  }
  if (local_c90.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c90.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c90.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c90.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_1058 != (code *)0x0) {
    (*local_1058)(&local_1068,&local_1068,__destroy_functor);
  }
  if (local_ca8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ca8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_ca8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_ca8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (local_1078 != (code *)0x0) {
    (*local_1078)(&local_1088,&local_1088,__destroy_functor);
  }
  if (local_cc0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_cc0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_cc0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_cc0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if (local_1098 != (code *)0x0) {
    (*local_1098)(&local_10a8,&local_10a8,__destroy_functor);
  }
  if (local_cd8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_cd8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_cd8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_cd8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_10b8 != (code *)0x0) {
    (*local_10b8)(&local_10c8,&local_10c8,__destroy_functor);
  }
  if (local_cf0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_cf0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_cf0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_cf0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if (local_10d8 != (code *)0x0) {
    (*local_10d8)(&local_10e8,&local_10e8,__destroy_functor);
  }
  if (local_d08.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d08.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d08.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d08.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if (local_10f8 != (code *)0x0) {
    (*local_10f8)(&local_1108,&local_1108,__destroy_functor);
  }
  if (local_d20.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d20.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d20.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d20.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if (local_1118 != (code *)0x0) {
    (*local_1118)(&local_1128,&local_1128,__destroy_functor);
  }
  if (local_d38.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d38.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d38.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d38.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if (local_1138 != (code *)0x0) {
    (*local_1138)(&local_1148,&local_1148,__destroy_functor);
  }
  if (local_d50.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d50.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d50.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d50.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if (local_1158 != (code *)0x0) {
    (*local_1158)(&local_1168,&local_1168,__destroy_functor);
  }
  if (local_d68.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d68.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d68.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d68.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if (local_1178 != (code *)0x0) {
    (*local_1178)(&local_1188,&local_1188,__destroy_functor);
  }
  if (local_d80.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d80.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d80.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d80.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  if (local_1198 != (code *)0x0) {
    (*local_1198)(&local_11a8,&local_11a8,__destroy_functor);
  }
  if (local_d98.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d98.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d98.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d98.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  if (local_11b8 != (code *)0x0) {
    (*local_11b8)(&local_11c8,&local_11c8,__destroy_functor);
  }
  if (local_db0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_db0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_db0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_db0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if (local_11d8 != (code *)0x0) {
    (*local_11d8)(&local_11e8,&local_11e8,__destroy_functor);
  }
  if (local_dc8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_dc8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_dc8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_dc8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if (local_11f8 != (code *)0x0) {
    (*local_11f8)(&local_1208,&local_1208,__destroy_functor);
  }
  if (local_de0.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_de0.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_de0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_de0.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
  }
  if (local_1218 != (code *)0x0) {
    (*local_1218)(&local_1228,&local_1228,__destroy_functor);
  }
  if (local_df8.
      super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_df8.
                    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_df8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_df8.
                          super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  if (local_1238 != (code *)0x0) {
    (*local_1238)(&local_1248,&local_1248,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if (local_1258 != (code *)0x0) {
    (*local_1258)(&local_1268,&local_1268,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,local_b08.field_2._M_allocated_capacity + 1);
  }
  if (local_1278 != (code *)0x0) {
    (*local_1278)(&local_1288,&local_1288,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p,local_b48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p,local_b68.field_2._M_allocated_capacity + 1);
  }
  if (local_1298 != (code *)0x0) {
    (*local_1298)(&local_12a8,&local_12a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p,local_b88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p,local_ba8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (undefined1  [8])&WasmSplitOption._M_string_length) {
    operator_delete((void *)local_58,WasmSplitOption._M_string_length + 1);
  }
  return;
}

Assistant:

WasmSplitOptions::WasmSplitOptions()
  : ToolOptions("wasm-split",
                "Split a module into a primary module and a secondary "
                "module, or instrument a module to gather a profile that "
                "can inform future splitting, or manage such profiles. Options "
                "that are only accepted in particular modes are marked with "
                "the accepted \"[<modes>]\" in their descriptions.") {
  const std::string WasmSplitOption = "wasm-split options";

  (*this)
    .add("--split",
         "",
         "Split an input module into two output modules. The default mode.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { mode = Mode::Split; })
    .add(
      "--multi-split",
      "",
      "Split an input module into an arbitrary number of output modules.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::MultiSplit; })
    .add(
      "--instrument",
      "",
      "Instrument an input module to allow it to generate a profile that can"
      " be used to guide splitting.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::Instrument; })
    .add("--merge-profiles",
         "",
         "Merge multiple profiles for the same module into a single profile.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           mode = Mode::MergeProfiles;
         })
    .add("--print-profile",
         "",
         "Print profile contents in a human-readable format.",
         WasmSplitOption,
         {Mode::PrintProfile},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           mode = Mode::PrintProfile;
           profileFile = argument;
         })
    .add(
      "--profile",
      "",
      "The profile to use to guide splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { profileFile = argument; })
    .add("--keep-funcs",
         "",
         "Comma-separated list of functions to keep in the primary module. The "
         "rest will be split out. Can be used alongside --profile and "
         "--split-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           keepFuncs = parseNameList(argument);
           hasKeepFuncs = true;
         })
    .add("--split-funcs",
         "",
         "Comma-separated list of functions to split out to the secondary "
         "module. The rest will be kept. Can be used alongside --profile and "
         "--keep-funcs. This takes precedence over other split options. "
         "You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           splitFuncs = parseNameList(argument);
           hasSplitFuncs = true;
         })
    .add(
      "--manifest",
      "",
      "File describing the functions to be split into each module. Each "
      "section separated by a blank line begins with the base name of an "
      "output module, which is followed by a list of functions to place in "
      "that module, one per line.",
      WasmSplitOption,
      {Mode::MultiSplit},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { manifestFile = argument; })
    .add("--out-prefix",
         "",
         "Prefix prepended to module names in the manifest file to create "
         "output file names.",
         WasmSplitOption,
         {Mode::MultiSplit},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { outPrefix = argument; })
    .add("--primary-output",
         "-o1",
         "Output file for the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           primaryOutput = argument;
         })
    .add("--secondary-output",
         "-o2",
         "Output file for the secondary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryOutput = argument;
         })
    .add("--symbolmap",
         "",
         "Write a symbol map file for each of the output modules.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { symbolMap = true; })
    .add(
      "--no-placeholders",
      "",
      "Do not import placeholder functions. Calls to secondary functions will "
      "fail before the secondary module has been instantiated.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { usePlaceholders = false; })
    .add(
      "--placeholdermap",
      "",
      "Write a file mapping placeholder indices to the function names.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { placeholderMap = true; })
    .add("--import-namespace",
         "",
         "When provided as an option for module splitting, the namespace from "
         "which to import objects from the primary "
         "module into the secondary module. In instrument mode, refers to the "
         "namespace from which to import the secondary memory, if any.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           importNamespace = argument;
         })
    .add("--placeholder-namespace",
         "",
         "The namespace from which to import placeholder functions into "
         "the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           placeholderNamespace = argument;
         })
    .add("--jspi",
         "",
         "Transform the module to support asynchronously loading the secondary "
         "module before any placeholder functions have been called.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { jspi = true; })
    .add(
      "--export-prefix",
      "",
      "An identifying prefix to prepend to new export names created "
      "by module splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { exportPrefix = argument; })
    .add("--profile-export",
         "",
         "The export name of the function the embedder calls to write the "
         "profile into memory. Defaults to `__write_profile`.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           profileExport = argument;
         })
    .add(
      "--in-memory",
      "",
      "Store profile information in memory (starting at address 0 and taking "
      "one byte per function) rather than globals (the default) so that "
      "it can be shared between multiple threads. Users are responsible for "
      "ensuring that the module does not use the initial memory region for "
      "anything else.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InMemory;
      })
    .add(
      "--in-secondary-memory",
      "",
      "Store profile information in a separate memory, rather than in module "
      "main memory or globals (the default). With this option, users do not "
      "need to reserve the initial memory region for profile data and the "
      "data can be shared between multiple threads.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InSecondaryMemory;
      })
    .add("--secondary-memory-name",
         "",
         "The name of the secondary memory created to store profile "
         "information.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryMemoryName = argument;
         })
    .add(
      "--emit-module-names",
      "",
      "Emit module names, even if not emitting the rest of the names section. "
      "Can help differentiate the modules in stack traces. This option will be "
      "removed once simpler ways of naming modules are widely available. See "
      "https://bugs.chromium.org/p/v8/issues/detail?id=11808.",
      WasmSplitOption,
      {Mode::Split, Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& arguments) { emitModuleNames = true; })
    .add("--initial-table",
         "",
         "A hack to ensure the split and instrumented modules have the same "
         "table size when using Emscripten's SPLIT_MODULE mode with dynamic "
         "linking. TODO: Figure out a more elegant solution for that use "
         "case and remove this.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           initialTableSize = std::stoi(argument);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file or files.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmSplitOption,
         {Mode::Split, Mode::MultiSplit, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) {
           passOptions.debugInfo = true;
         })
    .add("--output",
         "-o",
         "Output file.",
         WasmSplitOption,
         {Mode::Instrument, Mode::MergeProfiles, Mode::MultiSplit},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { output = argument; })
    .add("--unescape",
         "-u",
         "Un-escape function names (in print-profile output)",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { unescape = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode. Prints the functions that will be kept "
         "and split out when splitting a module.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           verbose = true;
           quiet = false;
         })
    .add_positional("INFILES",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      inputFiles.push_back(argument);
                    });
}